

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TtCofactorPerm(word *pTruth,int i,int nWords,int fSwapOnly,char *pCanonPerm,
                      uint *puCanonPhase,int fNaive)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  bVar6 = (byte)i;
  if (fSwapOnly == 0) {
    uVar9 = (ulong)(uint)nWords;
    if (0 < nWords) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)Abc_TtCofactorPerm::pCopy1 + lVar7) =
             *(undefined8 *)((long)pTruth + lVar7);
        lVar7 = lVar7 + 8;
      } while (uVar9 * 8 - lVar7 != 0);
    }
    uVar5 = Abc_TtCofactorPermConfig(pTruth,i,nWords,0,fNaive);
    uVar8 = uVar9;
    if (uVar5 == 0) {
      return 0;
    }
    do {
      if ((int)uVar8 < 1) goto LAB_004f6e02;
      lVar4 = uVar8 + 0x3ff;
      lVar7 = uVar8 - 1;
      uVar8 = uVar8 - 1;
    } while (pTruth[lVar7] == Abc_TtCofactorPermNaive::pBest[lVar4]);
    if (Abc_TtCofactorPermNaive::pBest[lVar4] <= pTruth[lVar7]) {
      if (nWords < 1) {
        return 0;
      }
      lVar7 = 0;
      do {
        *(undefined8 *)((long)pTruth + lVar7) =
             *(undefined8 *)((long)Abc_TtCofactorPerm::pCopy1 + lVar7);
        lVar7 = lVar7 + 8;
      } while (uVar9 << 3 != lVar7);
      return 0;
    }
LAB_004f6e02:
    if ((uVar5 & 1) != 0) {
      *puCanonPhase = *puCanonPhase ^ 1 << (bVar6 & 0x1f);
    }
    if ((uVar5 & 2) != 0) {
      *puCanonPhase = *puCanonPhase ^ 1 << (bVar6 + 1 & 0x1f);
    }
    uVar3 = uVar5 & 4;
  }
  else {
    uVar5 = Abc_TtCofactorPermConfig(pTruth,i,nWords,1,0);
    uVar3 = uVar5;
  }
  if (uVar3 != 0) {
    uVar3 = *puCanonPhase;
    iVar1 = i + 1;
    if (((uVar3 >> ((byte)iVar1 & 0x1f) ^ uVar3 >> (bVar6 & 0x1f)) & 1) != 0) {
      *puCanonPhase = 3 << (bVar6 & 0x1f) ^ uVar3;
    }
    cVar2 = pCanonPerm[i];
    pCanonPerm[i] = pCanonPerm[iVar1];
    pCanonPerm[iVar1] = cVar2;
  }
  return uVar5;
}

Assistant:

int Abc_TtCofactorPerm( word * pTruth, int i, int nWords, int fSwapOnly, char * pCanonPerm, unsigned * puCanonPhase, int fNaive )
{
    if ( fSwapOnly )
    {
        int Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 1, 0 );
        if ( Config )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
    {
        static word pCopy1[1024];
        int Config;
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 0, fNaive );
        if ( Config == 0 )
            return 0;
        if ( Abc_TtCompareRev(pTruth, pCopy1, nWords) == 1 ) // made it worse
        {
            Abc_TtCopy( pTruth, pCopy1, nWords, 0 );
            return 0;
        }
        // improved
        if ( Config & 1 )
            *puCanonPhase ^= (1 << i);
        if ( Config & 2 )
            *puCanonPhase ^= (1 << (i+1));
        if ( Config & 4 )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
}